

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O2

NaReal __thiscall NaVector::distance(NaVector *this,NaVector *that)

{
  uint uVar1;
  ulong uVar2;
  double dVar3;
  double local_20;
  
  local_20 = 0.0;
  uVar2 = 0;
  while( true ) {
    uVar1 = (*this->_vptr_NaVector[6])(this);
    if (uVar1 <= uVar2) break;
    dVar3 = this->pVect[uVar2] - that->pVect[uVar2];
    local_20 = local_20 + dVar3 * dVar3;
    uVar2 = uVar2 + 1;
  }
  if (0.0 <= local_20) {
    return SQRT(local_20);
  }
  dVar3 = sqrt(local_20);
  return dVar3;
}

Assistant:

NaReal
NaVector::distance (const NaVector& that) const
{
    unsigned    i;
    NaReal      vDist = 0.0;
    NaReal      vTmp;
    for(i = 0; i < dim(); ++i){
        vTmp = pVect[i] - that.pVect[i];
        vDist += vTmp * vTmp;
    }
    return sqrt(vDist);
}